

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O1

string * CLI::detail::convert_arg_for_ini(string *__return_storage_ptr__,string *arg)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long lVar8;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x02');
    return __return_storage_ptr__;
  }
  iVar6 = ::std::__cxx11::string::compare((char *)arg);
  if ((((iVar6 == 0) || (iVar6 = ::std::__cxx11::string::compare((char *)arg), iVar6 == 0)) ||
      (iVar6 = ::std::__cxx11::string::compare((char *)arg), iVar6 == 0)) ||
     ((iVar6 = ::std::__cxx11::string::compare((char *)arg), iVar6 == 0 ||
      (((iVar6 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar6 != 0 &&
        (iVar6 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar6 != 0)) &&
       (bVar5 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,(double *)&local_38), bVar5))))))
  goto LAB_00115689;
  sVar2 = arg->_M_string_length;
  if (sVar2 == 1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\'","");
    ::std::operator+(&local_38,&local_58,arg);
    ::std::operator+(__return_storage_ptr__,&local_38,'\'');
    goto LAB_001156eb;
  }
  pcVar3 = (arg->_M_dataplus)._M_p;
  if (*pcVar3 == '0') {
    cVar1 = pcVar3[1];
    if (cVar1 == 'b') {
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_3_>>
                        (pcVar3 + 2,pcVar3 + sVar2);
    }
    else if (cVar1 == 'o') {
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_2_>>
                        (pcVar3 + 2,pcVar3 + sVar2);
    }
    else {
      if (cVar1 != 'x') goto LAB_00115631;
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&)::_lambda(char)_1_>>
                        (pcVar3 + 2,pcVar3 + sVar2);
    }
    if (_Var7._M_current == pcVar3 + sVar2) {
LAB_00115689:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (arg->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar4 + arg->_M_string_length);
      return __return_storage_ptr__;
    }
  }
LAB_00115631:
  lVar8 = ::std::__cxx11::string::find((char)arg,0x22);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  if (lVar8 == -1) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\"","");
    ::std::operator+(&local_38,&local_58,arg);
    ::std::operator+(__return_storage_ptr__,&local_38,'\"');
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\'","");
    ::std::operator+(&local_38,&local_58,arg);
    ::std::operator+(__return_storage_ptr__,&local_38,'\'');
  }
LAB_001156eb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string convert_arg_for_ini(const std::string &arg) {
    if(arg.empty()) {
        return std::string(2, '"');
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        double val;
        if(detail::lexical_cast(arg, val)) {
            return arg;
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        return std::string("'") + arg + '\'';
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(arg.find_first_of('"') == std::string::npos) {
        return std::string("\"") + arg + '"';
    } else {
        return std::string("'") + arg + '\'';
    }
}